

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O0

short duckdb::VectorDecimalCastOperator<duckdb::TryCastToDecimal>::Operation<unsigned_char,short>
                (uchar input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  short result_value;
  VectorDecimalCastData *data;
  undefined6 in_stack_ffffffffffffff88;
  uint8_t in_stack_ffffffffffffff8e;
  uint8_t in_stack_ffffffffffffff8f;
  CastParameters *in_stack_ffffffffffffff90;
  allocator *idx_00;
  ValidityMask *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  uint8_t in_stack_ffffffffffffffa7;
  allocator local_51;
  string local_50 [38];
  short local_2a;
  short local_2;
  
  bVar1 = TryCastToDecimal::Operation<unsigned_char,short>
                    (in_stack_ffffffffffffffa7,(int16_t *)in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f,in_stack_ffffffffffffff8e);
  if (bVar1) {
    local_2 = local_2a;
  }
  else {
    idx_00 = &local_51;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_50,"Failed to cast decimal value",idx_00);
    local_2 = HandleVectorCastError::Operation<short>
                        ((string *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98,(idx_t)idx_00,
                         (VectorTryCastData *)
                         CONCAT17(in_stack_ffffffffffffff8f,
                                  CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
    ::std::__cxx11::string::~string(local_50);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return local_2;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorDecimalCastData *>(dataptr);
		RESULT_TYPE result_value;
		if (!OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, result_value, data->vector_cast_data.parameters,
		                                                     data->width, data->scale)) {
			return HandleVectorCastError::Operation<RESULT_TYPE>("Failed to cast decimal value", mask, idx,
			                                                     data->vector_cast_data);
		}
		return result_value;
	}